

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void stat_cb(uv_fs_t *req)

{
  if (req == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_0015a02c;
    if (stat_req.result != 0) goto LAB_0015a031;
    if (stat_req.ptr == (void *)0x0) goto LAB_0015a036;
    stat_cb_count = stat_cb_count + 1;
    req = &stat_req;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    stat_cb_cold_1();
LAB_0015a02c:
    stat_cb_cold_2();
LAB_0015a031:
    stat_cb_cold_3();
LAB_0015a036:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (req == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_0015a078;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_0015a078:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (req == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_0015a0dc;
    if (rmdir_req.result != 0) goto LAB_0015a0e1;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_0015a0eb;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_0015a0dc:
    rmdir_cb_cold_2();
LAB_0015a0e1:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_0015a0eb:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x10009);
  return;
}

Assistant:

static void stat_cb(uv_fs_t* req) {
  ASSERT(req == &stat_req);
  ASSERT(req->fs_type == UV_FS_STAT || req->fs_type == UV_FS_LSTAT);
  ASSERT(req->result == 0);
  ASSERT(req->ptr);
  stat_cb_count++;
  uv_fs_req_cleanup(req);
  ASSERT(!req->ptr);
}